

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_map_insert(mg_map *map,char *key_str,mg_value *value)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  mg_string *pmVar5;
  
  sVar4 = strlen(key_str);
  if (sVar4 < 0xffffffff) {
    uVar1 = map->size;
    if (uVar1 < map->capacity) {
      uVar2 = mg_map_find_key(map,(uint32_t)sVar4,key_str);
      if (uVar2 == uVar1) {
        pmVar5 = mg_string_make2((uint32_t)sVar4,key_str);
        if (pmVar5 == (mg_string *)0x0) {
          iVar3 = -3;
        }
        else {
          uVar1 = map->size;
          map->keys[uVar1] = pmVar5;
          map->values[uVar1] = value;
          map->size = uVar1 + 1;
          iVar3 = 0;
        }
      }
      else {
        iVar3 = -7;
      }
    }
    else {
      iVar3 = -4;
    }
  }
  else {
    iVar3 = -0x10;
  }
  return iVar3;
}

Assistant:

int mg_map_insert(mg_map *map, const char *key_str, mg_value *value) {
  size_t key_size = strlen(key_str);
  if (key_size >= UINT32_MAX) {
    return MG_ERROR_SIZE_EXCEEDED;
  }
  if (map->size >= map->capacity) {
    return MG_ERROR_CONTAINER_FULL;
  }
  if (mg_map_find_key(map, (uint32_t)key_size, key_str) != map->size) {
    return MG_ERROR_DUPLICATE_KEY;
  }
  mg_string *key = mg_string_make2((uint32_t)key_size, key_str);
  if (!key) {
    return MG_ERROR_OOM;
  }
  mg_map_append(map, key, value);
  return 0;
}